

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator+=(TPZFMatrix<long_double> *this,TPZMatrix<long_double> *aBase)

{
  longdouble *plVar1;
  int64_t iVar2;
  int64_t iVar3;
  long in_RSI;
  TPZFMatrix<long_double> *in_RDI;
  longdouble *pa;
  longdouble *pmlast;
  longdouble *pm;
  int64_t size;
  TPZFMatrix<long_double> *A;
  char *in_stack_00000158;
  char *in_stack_00000160;
  TPZBaseMatrix *local_50;
  _func_int **local_38;
  longdouble *local_28;
  
  if (in_RSI == 0) {
    local_50 = (TPZBaseMatrix *)0x0;
  }
  else {
    local_50 = (TPZBaseMatrix *)__dynamic_cast(in_RSI,&TPZMatrix<long_double>::typeinfo,&typeinfo,0)
    ;
  }
  if (local_50 == (TPZBaseMatrix *)0x0) {
    Error(in_stack_00000160,in_stack_00000158);
  }
  iVar2 = TPZBaseMatrix::Rows(local_50);
  iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  if (iVar2 == iVar3) {
    iVar2 = TPZBaseMatrix::Cols(local_50);
    iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
    if (iVar2 == iVar3) goto LAB_012285c5;
  }
  Error(in_stack_00000160,in_stack_00000158);
LAB_012285c5:
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  plVar1 = in_RDI->fElem;
  local_38 = local_50[1].super_TPZSavable._vptr_TPZSavable;
  local_28 = plVar1;
  while (local_28 < plVar1 + iVar2 * iVar3) {
    *local_28 = *local_28 + *(longdouble *)local_38;
    local_38 = local_38 + 2;
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar> & TPZFMatrix<TVar>::operator+=(const TPZMatrix<TVar> &aBase ) {
    auto A = dynamic_cast<const TPZFMatrix<TVar>*>(&aBase);
    if(!A){
        Error(__PRETTY_FUNCTION__," incompatible argument");
    }
    if ( (A->Rows() != this->Rows())  ||  (A->Cols() != this->Cols()) )
        Error( "Operator+= <matrices with different dimensions>" );
    
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * pm = fElem, *pmlast=pm+size;
    TVar * pa = A->fElem;
    while(pm < pmlast) (*pm++) += (*pa++);
    return( *this );
}